

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O2

Boxed_Value __thiscall
chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Prefix_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this
             ,Dispatch_State *t_ss)

{
  Opers t_oper;
  uint uVar1;
  eval_error *this_00;
  Dispatch_State *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar2;
  string_view t_name;
  Boxed_Value bv;
  Function_Push_Pop fpp;
  Boxed_Value local_78;
  Function_Push_Pop local_68 [4];
  string local_48;
  
  BVar2 = AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::eval
                    ((AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
                      *)&local_78,*(Dispatch_State **)t_ss[2].m_conversions.m_conversions._M_data);
  t_oper = *(Opers *)&t_ss[3].m_stack_holder._M_data;
  if (((t_oper == bitwise_and) || (t_oper == invalid)) ||
     (uVar1 = ((local_78.m_data.
                super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               )->m_type_info).m_flags, (uVar1 & 0x10) == 0)) {
    detail::Function_Push_Pop::Function_Push_Pop(local_68,in_RDX);
    local_48._M_dataplus._M_p = (pointer)&local_78;
    local_48._M_string_length = (size_type)local_68;
    detail::Function_Push_Pop::save_params(local_68,(Function_Params *)&local_48);
    t_name._M_str = &((t_ss->m_conversions).m_saves._M_data)->enabled;
    t_name._M_len = (size_t)(in_RDX->m_engine)._M_data;
    local_48._M_dataplus._M_p = (pointer)&local_78;
    local_48._M_string_length = (size_type)local_68;
    chaiscript::detail::Dispatch_Engine::call_function
              ((Dispatch_Engine *)this,t_name,
               (atomic_uint_fast32_t *)(t_ss->m_conversions).m_conversions._M_data,
               (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&local_48);
    detail::Function_Push_Pop::~Function_Push_Pop(local_68);
  }
  else {
    if ((t_oper - pre_increment < 2) && ((uVar1 & 1) != 0)) {
      this_00 = (eval_error *)
                __cxa_allocate_exception
                          (0x90,t_oper,
                           BVar2.m_data.
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,
                 "Error with prefix operator evaluation: cannot modify constant value.",
                 (allocator<char> *)local_68);
      exception::eval_error::eval_error(this_00,&local_48);
      __cxa_throw(this_00,&exception::eval_error::typeinfo,exception::eval_error::~eval_error);
    }
    Boxed_Number::oper((Boxed_Number *)this,t_oper,&local_78);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_78.m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar2.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const override {
        Boxed_Value bv(this->children[0]->eval(t_ss));

        try {
          // short circuit arithmetic operations
          if (m_oper != Operators::Opers::invalid && m_oper != Operators::Opers::bitwise_and && bv.get_type_info().is_arithmetic()) {
            if ((m_oper == Operators::Opers::pre_increment || m_oper == Operators::Opers::pre_decrement) && bv.is_const()) {
              throw exception::eval_error("Error with prefix operator evaluation: cannot modify constant value.");
            }
            return Boxed_Number::do_oper(m_oper, bv);
          } else {
            chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
            fpp.save_params(Function_Params{bv});
            return t_ss->call_function(this->text, m_loc, Function_Params{bv}, t_ss.conversions());
          }
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Error with prefix operator evaluation: '" + this->text + "'", e.parameters, e.functions, false, *t_ss);
        }
      }